

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O3

int __thiscall
helics::zeromq::ZmqCommsSS::replyToIncomingMessage(ZmqCommsSS *this,message_t *msg,socket_t *sock)

{
  int iVar1;
  void *data;
  size_t size;
  error_t *peVar2;
  string str;
  ActionMessage resp;
  ActionMessage M;
  string local_1b8;
  ActionMessage local_198;
  ActionMessage local_e0;
  
  data = (void *)zmq_msg_data(msg);
  size = zmq_msg_size(msg);
  ActionMessage::ActionMessage(&local_e0,data,size);
  if (((local_e0.messageAction == cmd_protocol_priority) ||
      (local_e0.messageAction == cmd_protocol_big)) || (local_e0.messageAction == cmd_protocol)) {
    iVar1 = -1;
    if (local_e0.messageID == 0x16570bf) goto LAB_002d0134;
    NetworkCommsInterface::generateReplyToIncomingMessage
              (&local_198,&this->super_NetworkCommsInterface,&local_e0);
    ActionMessage::to_string_abi_cxx11_(&local_1b8,&local_198);
    iVar1 = zmq_send((sock->super_socket_base)._handle,local_1b8._M_dataplus._M_p,
                     local_1b8._M_string_length,0);
    if (iVar1 < 0) {
      iVar1 = zmq_errno();
      if (iVar1 != 0xb) {
        peVar2 = (error_t *)__cxa_allocate_exception(0x10);
        zmq::error_t::error_t(peVar2);
        __cxa_throw(peVar2,&zmq::error_t::typeinfo,std::exception::~exception);
      }
    }
  }
  else {
    if ((this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback.super__Function_base
        ._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback._M_invoker)
              ((_Any_data *)&(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback
               ,&local_e0);
    ActionMessage::ActionMessage(&local_198,cmd_priority_ack);
    ActionMessage::to_string_abi_cxx11_(&local_1b8,&local_198);
    iVar1 = zmq_send((sock->super_socket_base)._handle,local_1b8._M_dataplus._M_p,
                     local_1b8._M_string_length,0);
    if (iVar1 < 0) {
      iVar1 = zmq_errno();
      if (iVar1 != 0xb) {
        peVar2 = (error_t *)__cxa_allocate_exception(0x10);
        zmq::error_t::error_t(peVar2);
        __cxa_throw(peVar2,&zmq::error_t::typeinfo,std::exception::~exception);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  ActionMessage::~ActionMessage(&local_198);
  iVar1 = 0;
LAB_002d0134:
  ActionMessage::~ActionMessage(&local_e0);
  return iVar1;
}

Assistant:

int ZmqCommsSS::replyToIncomingMessage(zmq::message_t& msg, zmq::socket_t& sock)
{
    ActionMessage M(static_cast<std::byte*>(msg.data()), msg.size());
    if (isProtocolCommand(M)) {
        if (M.messageID == CLOSE_RECEIVER) {
            return (-1);
        }
        auto reply = generateReplyToIncomingMessage(M);
        auto str = reply.to_string();
        sock.send(str);
        return 0;
    }
    ActionCallback(std::move(M));
    ActionMessage resp(CMD_PRIORITY_ACK);
    auto str = resp.to_string();
    sock.send(str);
    return 0;
}